

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.cpp
# Opt level: O0

bool match(string *s,string *longarg,string *shortarg)

{
  __type _Var1;
  string *in_RDI;
  __type local_6e;
  string local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string local_40 [48];
  string *local_10;
  __type local_1;
  
  local_10 = in_RDI;
  std::__cxx11::string::string(local_40,in_RDI);
  _Var1 = std::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_6e = true;
  if (!_Var1) {
    std::__cxx11::string::string(local_60,local_10);
    local_6e = std::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  local_1 = local_6e;
  if (!_Var1) {
    std::__cxx11::string::~string(local_60);
  }
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool match(const std::string& s, const std::string& longarg, const std::string& shortarg)
{ return std::string(s) == longarg || std::string(s) == shortarg; }